

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O1

void ParseFunctionParameters
               (FScanner *sc,PClassActor *cls,TArray<FxExpression_*,_FxExpression_*> *out_params,
               PFunction *afd,FString *statestring,FStateDefinitions *statedef)

{
  int iVar1;
  Variant *pVVar2;
  PPrototype *pPVar3;
  PStatePointer *pPVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  FxExpression *this;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FScriptPosition local_68;
  PFunction *local_58;
  _func_int **local_50;
  _func_int **local_48;
  FString *local_40;
  PClassActor *local_38;
  
  pVVar2 = (afd->Variants).Array;
  pPVar3 = pVVar2->Implementation->Proto;
  uVar9 = afd->Flags;
  iVar8 = (int)(uVar9 << 0x1e) >> 0x1f;
  uVar10 = (ulong)(uVar9 >> 1 & 3);
  iVar7 = iVar8 + -2;
  if ((uVar9 & 4) == 0) {
    iVar7 = iVar8;
  }
  iVar7 = iVar7 + (pPVar3->ArgumentTypes).Count;
  local_40 = statestring;
  local_38 = cls;
  if (iVar7 < 0) {
    __assert_fail("numparams >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_states.cpp"
                  ,0x272,
                  "void ParseFunctionParameters(FScanner &, PClassActor *, TArray<FxExpression *> &, PFunction *, FString, FStateDefinitions *)"
                 );
  }
  local_58 = afd;
  if ((iVar7 == 0) || (((pVVar2->ArgFlags).Array[uVar10] & 1) != 0)) {
    bVar5 = FScanner::CheckString(sc,"(");
    if (!bVar5) {
      return;
    }
  }
  else {
    FScanner::MustGetStringName(sc,"(");
  }
  local_48 = (_func_int **)&PTR__FxExpression_008683a0;
  local_50 = (_func_int **)&PTR__FxConstant_008682d0;
  iVar8 = iVar7;
  do {
    uVar9 = (uint)uVar10;
    if (iVar8 < 1) {
      if (iVar7 != 0) {
        FScanner::MustGetStringName(sc,")");
        return;
      }
      bVar5 = FScanner::CheckString(sc,")");
      if (bVar5) {
        return;
      }
      FScanner::ScriptError
                (sc,"You cannot pass parameters to \'%s\'\n",
                 FName::NameData.NameArray
                 [*(int *)&(local_58->super_PSymbol).super_DObject.field_0x24].Text);
      return;
    }
    if (((statedef == (FStateDefinitions *)0x0) ||
        ((pPVar3->ArgumentTypes).Array[(int)uVar9] != (PType *)TypeState)) ||
       (bVar5 = FScanner::CheckNumber(sc), !bVar5)) {
      this = ParseParameter(sc,local_38,(pPVar3->ArgumentTypes).Array[(int)uVar9],false);
    }
    else {
      if ((0 < sc->Number) && (1 < *(uint *)(local_40->Chars + -0xc))) {
        FScanner::ScriptError
                  (sc,
                   "You cannot use state jumps commands with a jump offset on multistate definitions\n"
                  );
      }
      iVar1 = sc->Number;
      if (iVar1 < 0) {
        FScanner::ScriptError(sc,"Negative jump offsets are not allowed");
      }
      if (iVar1 < 1) {
        this = (FxExpression *)operator_new(0x48);
        FScriptPosition::FScriptPosition(&local_68,sc);
        FxExpression::FxExpression(this,&local_68);
        this->_vptr_FxExpression = local_50;
        this[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
        this[1].JumpAddresses.Array = (FxJumpStatement **)0x0;
        pPVar4 = TypeState;
        this[1]._vptr_FxExpression = (_func_int **)TypeState;
        this->ValueType = (PType *)pPVar4;
        this->isresolved = true;
      }
      else {
        this = (FxExpression *)operator_new(0x38);
        uVar11 = (statedef->StateArray).Count;
        FScriptPosition::FScriptPosition(&local_68,sc);
        FxExpression::FxExpression(this,&local_68);
        this->_vptr_FxExpression = local_48;
        *(uint *)&this->field_0x34 = uVar11 + iVar1;
      }
      FString::~FString(&local_68.FileName);
    }
    TArray<FxExpression_*,_FxExpression_*>::Grow(out_params,1);
    uVar11 = out_params->Count;
    out_params->Array[uVar11] = this;
    out_params->Count = uVar11 + 1;
    uVar11 = uVar9 + 1;
    bVar5 = true;
    iVar1 = 0;
    if (iVar8 != 1) {
      iVar1 = iVar8 + -1;
      if ((pPVar3->ArgumentTypes).Array[(int)uVar11] == (PType *)0x0) {
        bVar6 = FScanner::CheckString(sc,")");
        if (bVar6) goto LAB_0067c9dc;
      }
      else {
        iVar8 = iVar1;
        uVar9 = uVar11;
        if ((((pVVar2->ArgFlags).Array[(int)uVar11] & 1) != 0) &&
           (bVar6 = FScanner::CheckString(sc,")"), bVar6)) {
LAB_0067c9dc:
          bVar5 = false;
          goto LAB_0067c9f8;
        }
      }
      uVar11 = uVar9;
      FScanner::MustGetStringName(sc,",");
      iVar1 = iVar8;
    }
LAB_0067c9f8:
    iVar8 = iVar1;
    uVar10 = (ulong)uVar11;
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void ParseFunctionParameters(FScanner &sc, PClassActor *cls, TArray<FxExpression *> &out_params,
	PFunction *afd, FString statestring, FStateDefinitions *statedef)
{
	const TArray<PType *> &params = afd->Variants[0].Implementation->Proto->ArgumentTypes;
	const TArray<DWORD> &paramflags = afd->Variants[0].ArgFlags;
	int numparams = (int)params.Size();
	int pnum = 0;
	bool zeroparm;

	if (afd->Flags & VARF_Method)
	{
		numparams--;
		pnum++;
	}
	if (afd->Flags & VARF_Action)
	{
		numparams -= 2;
		pnum += 2;
	}
	assert(numparams >= 0);
	zeroparm = numparams == 0;
	if (numparams > 0 && !(paramflags[pnum] & VARF_Optional))
	{
		sc.MustGetStringName("(");
	}
	else
	{
		if (!sc.CheckString("(")) 
		{
			return;
		}
	}
	while (numparams > 0)
	{
		FxExpression *x;
		if (statedef != NULL && params[pnum] == TypeState && sc.CheckNumber())
		{
			// Special case: State label as an offset
			if (sc.Number > 0 && statestring.Len() > 1)
			{
				sc.ScriptError("You cannot use state jumps commands with a jump offset on multistate definitions\n");
			}

			int v = sc.Number;
			if (v < 0)
			{
				sc.ScriptError("Negative jump offsets are not allowed");
			}

			if (v > 0)
			{
				x = new FxStateByIndex(statedef->GetStateCount() + v, sc);
			}
			else
			{
				x = new FxConstant((FState*)NULL, sc);
			}
		}
		else
		{
			// Use the generic parameter parser for everything else
			x = ParseParameter(sc, cls, params[pnum], false);
		}
		out_params.Push(x);
		pnum++;
		numparams--;
		if (numparams > 0)
		{
			if (params[pnum] == NULL)
			{ // varargs function
				if (sc.CheckString(")"))
				{
					return;
				}
				pnum--;
				numparams++;
			}
			else if ((paramflags[pnum] & VARF_Optional) && sc.CheckString(")"))
			{
				return;
			}
			sc.MustGetStringName (",");
		}
	}
	if (zeroparm)
	{
		if (!sc.CheckString(")"))
		{
			sc.ScriptError("You cannot pass parameters to '%s'\n", afd->SymbolName.GetChars());
		}
	}
	else
	{
		sc.MustGetStringName(")");
	}
}